

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O1

bool __thiscall
picojson::input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::match
          (input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this,string *pattern)

{
  int iVar1;
  FILE *extraout_RDX;
  FILE *extraout_RDX_00;
  FILE *__stream;
  int __c;
  char *pcVar2;
  bool bVar3;
  FILE *__stream_00;
  
  bVar3 = pattern->_M_string_length == 0;
  if (!bVar3) {
    pcVar2 = (pattern->_M_dataplus)._M_p;
    __stream_00 = (FILE *)pattern;
    iVar1 = getc(this,(FILE *)pattern);
    __c = (int)__stream_00;
    __stream = extraout_RDX;
    if (iVar1 == *pcVar2) {
      do {
        pcVar2 = pcVar2 + 1;
        bVar3 = pcVar2 == (pattern->_M_dataplus)._M_p + pattern->_M_string_length;
        if (bVar3) {
          return bVar3;
        }
        iVar1 = getc(this,__stream_00);
        __c = (int)__stream_00;
        __stream = extraout_RDX_00;
      } while (iVar1 == *pcVar2);
    }
    ungetc(this,__c,__stream);
  }
  return bVar3;
}

Assistant:

bool match(const std::string& pattern) {
      for (std::string::const_iterator pi(pattern.begin());
       pi != pattern.end();
       ++pi) {
    if (getc() != *pi) {
      ungetc();
      return false;
    }
      }
      return true;
    }